

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.cc
# Opt level: O0

bool isbinary(io_buf *i)

{
  char **ppcVar1;
  ssize_t sVar2;
  long in_RDI;
  bool bVar3;
  bool ret;
  int in_stack_00000034;
  io_buf *in_stack_00000038;
  
  ppcVar1 = v_array<char>::end((v_array<char> *)(in_RDI + 0x10));
  if (*ppcVar1 == *(char **)(in_RDI + 0x60)) {
    v_array<int>::operator[]((v_array<int> *)(in_RDI + 0x30),*(size_t *)(in_RDI + 0x58));
    sVar2 = io_buf::fill(in_stack_00000038,in_stack_00000034);
    if (sVar2 < 1) {
      return false;
    }
  }
  bVar3 = **(char **)(in_RDI + 0x60) == '\0';
  if (bVar3) {
    *(long *)(in_RDI + 0x60) = *(long *)(in_RDI + 0x60) + 1;
  }
  return bVar3;
}

Assistant:

bool isbinary(io_buf& i)
{
  if (i.space.end() == i.head)
    if (i.fill(i.files[i.current]) <= 0)
      return false;

  bool ret = (*i.head == 0);
  if (ret)
    i.head++;

  return ret;
}